

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void UYVYToUVRow_C(uint8 *src_uyvy,int src_stride_uyvy,uint8 *dst_u,uint8 *dst_v,int width)

{
  long lVar1;
  int iVar2;
  
  if (0 < width) {
    lVar1 = 0;
    iVar2 = 0;
    do {
      dst_u[lVar1] = (uint8)((uint)src_uyvy[lVar1 * 4] +
                             (uint)src_uyvy[lVar1 * 4 + (long)src_stride_uyvy] + 1 >> 1);
      dst_v[lVar1] = (uint8)((uint)src_uyvy[lVar1 * 4 + 2] +
                             (uint)src_uyvy[lVar1 * 4 + (long)src_stride_uyvy + 2] + 1 >> 1);
      iVar2 = iVar2 + 2;
      lVar1 = lVar1 + 1;
    } while (iVar2 < width);
  }
  return;
}

Assistant:

void UYVYToUVRow_C(const uint8* src_uyvy,
                   int src_stride_uyvy,
                   uint8* dst_u,
                   uint8* dst_v,
                   int width) {
  // Output a row of UV values.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_u[0] = (src_uyvy[0] + src_uyvy[src_stride_uyvy + 0] + 1) >> 1;
    dst_v[0] = (src_uyvy[2] + src_uyvy[src_stride_uyvy + 2] + 1) >> 1;
    src_uyvy += 4;
    dst_u += 1;
    dst_v += 1;
  }
}